

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void prvTidySortAttributes(TidyDocImpl *doc,Node *node,TidyAttrSortStrategy strat)

{
  tmbstr *pptVar1;
  AttVal *pAVar2;
  AttVal *pAVar3;
  AttVal *pAVar4;
  AttVal *pAVar5;
  AttVal *pAVar6;
  AttVal *pAVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  code *pcVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  AttVal *local_48;
  
  do {
    if (node == (Node *)0x0) {
      return;
    }
    local_48 = node->attributes;
    pptVar1 = (doc->attribs).priorityAttribs.list;
    pcVar11 = AlphaComparator;
    if ((strat == TidySortAttrAlpha) ||
       (((strat == TidySortAttrNone && (pptVar1 != (tmbstr *)0x0)) &&
        (pcVar11 = PriorityComparator, *pptVar1 != (tmbstr)0x0)))) {
      if (local_48 == (AttVal *)0x0) {
        local_48 = (AttVal *)0x0;
      }
      else {
        iVar8 = 1;
        pAVar3 = local_48;
        do {
          local_48 = (AttVal *)0x0;
          iVar10 = 0;
          if (0 < iVar8) {
            iVar10 = iVar8;
          }
          pAVar5 = (AttVal *)0x0;
          uVar12 = 0;
LAB_0013750d:
          if (pAVar3 != (AttVal *)0x0) {
            uVar12 = uVar12 + 1;
            iVar13 = 0;
            pAVar7 = pAVar3;
            do {
              pAVar4 = pAVar3;
              pAVar6 = pAVar5;
              pAVar2 = local_48;
              iVar14 = iVar10;
              iVar9 = iVar8;
              if (iVar10 == iVar13) goto LAB_0013753b;
              iVar13 = iVar13 + 1;
              pAVar7 = pAVar7->next;
            } while (pAVar7 != (AttVal *)0x0);
            pAVar7 = (AttVal *)0x0;
            iVar14 = iVar13;
LAB_0013753b:
            do {
              local_48 = pAVar2;
              pAVar3 = pAVar7;
              pAVar5 = pAVar6;
              if (iVar14 < 1) {
                if ((iVar9 < 1) || (pAVar3 == (AttVal *)0x0)) goto LAB_0013750d;
                if (iVar14 != 0) goto LAB_0013755b;
                iVar9 = iVar9 + -1;
                iVar14 = 0;
                pAVar6 = pAVar3;
                pAVar3 = pAVar3->next;
              }
              else {
LAB_0013755b:
                pAVar6 = pAVar4;
                if ((iVar9 == 0) || (pAVar3 == (AttVal *)0x0)) {
                  iVar14 = iVar14 + -1;
                  pAVar4 = pAVar4->next;
                }
                else {
                  iVar13 = (*pcVar11)(pAVar4,pAVar3,pptVar1);
                  if (iVar13 < 1) {
                    pAVar4 = pAVar4->next;
                    iVar14 = iVar14 + -1;
                  }
                  else {
                    iVar9 = iVar9 + -1;
                    pAVar6 = pAVar3;
                    pAVar3 = pAVar3->next;
                  }
                }
              }
              pAVar7 = pAVar3;
              pAVar2 = pAVar6;
              if (pAVar5 != (AttVal *)0x0) {
                pAVar5->next = pAVar6;
                pAVar2 = local_48;
              }
            } while( true );
          }
          pAVar5->next = (AttVal *)0x0;
          iVar8 = iVar8 * 2;
          pAVar3 = local_48;
        } while (1 < uVar12);
      }
    }
    node->attributes = local_48;
    if (node->content != (Node *)0x0) {
      prvTidySortAttributes(doc,node->content,strat);
    }
    node = node->next;
  } while( true );
}

Assistant:

void TY_(SortAttributes)(TidyDocImpl* doc, Node* node, TidyAttrSortStrategy strat)
{
    while (node)
    {
        node->attributes = SortAttVal( doc, node->attributes, strat );
        if (node->content)
            TY_(SortAttributes)(doc, node->content, strat);
        node = node->next;
    }
}